

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_base_loopcontinue(event_base *event_base)

{
  unsigned_long uVar1;
  int iVar2;
  unsigned_long uVar3;
  
  if (event_base == (event_base *)0x0) {
    iVar2 = -1;
  }
  else {
    if (event_base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,event_base->th_base_lock);
    }
    event_base->event_continue = 1;
    iVar2 = 0;
    if ((evthread_id_fn_ != (_func_unsigned_long *)0x0) &&
       (iVar2 = 0, event_base->running_loop != 0)) {
      uVar1 = event_base->th_owner_id;
      uVar3 = (*evthread_id_fn_)();
      if (uVar1 != uVar3) {
        iVar2 = evthread_notify_base(event_base);
      }
    }
    if (event_base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,event_base->th_base_lock);
    }
  }
  return iVar2;
}

Assistant:

int
event_base_loopcontinue(struct event_base *event_base)
{
	int r = 0;
	if (event_base == NULL)
		return (-1);

	EVBASE_ACQUIRE_LOCK(event_base, th_base_lock);
	event_base->event_continue = 1;

	if (EVBASE_NEED_NOTIFY(event_base)) {
		r = evthread_notify_base(event_base);
	} else {
		r = (0);
	}
	EVBASE_RELEASE_LOCK(event_base, th_base_lock);
	return r;
}